

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

SeatPromptResult *
console_confirm_weak_cached_hostkey
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *algname,char *betteralgs,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  undefined1 local_10c [8];
  termios newmode;
  termios oldmode;
  termios cf;
  char line [32];
  void *ctx_local;
  _func_void_void_ptr_SeatPromptResult *callback_local;
  char *betteralgs_local;
  char *algname_local;
  Seat *seat_local;
  
  premsg((termios *)&oldmode.c_ispeed);
  fprintf(_stderr,
          "The first host key type we have stored for this server\nis %s, which is below the configured warning threshold.\nThe server also provides the following types of host key\nabove the threshold, which we do not have stored:\n%s\n"
          ,algname,betteralgs);
  if ((console_batch_mode & 1U) == 0) {
    fputs("Continue with connection? (y/n) ",_stderr);
    fflush(_stderr);
    tcgetattr(0,(termios *)&newmode.c_ispeed);
    memcpy(local_10c,&newmode.c_ispeed,0x3c);
    newmode.c_oflag = newmode.c_oflag | 0xb;
    tcsetattr(0,0,(termios *)local_10c);
    cf.c_ispeed._0_1_ = '\0';
    block_and_read(0,&cf.c_ispeed,0x1f);
    tcsetattr(0,0,(termios *)&newmode.c_ispeed);
    if (((char)cf.c_ispeed == 'y') || ((char)cf.c_ispeed == 'Y')) {
      postmsg((termios *)&oldmode.c_ispeed);
      make_spr_simple(__return_storage_ptr__,SPRK_OK);
    }
    else {
      fputs("Connection abandoned.\n",_stderr);
      postmsg((termios *)&oldmode.c_ispeed);
      make_spr_simple(__return_storage_ptr__,SPRK_USER_ABORT);
    }
  }
  else {
    fputs("Connection abandoned.\n",_stderr);
    postmsg((termios *)&oldmode.c_ispeed);
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot confirm a weak cached host key in batch mode");
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_confirm_weak_cached_hostkey(
    Seat *seat, const char *algname, const char *betteralgs,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;

    premsg(&cf);
    fprintf(stderr, weakhk_msg_common_fmt, algname, betteralgs);

    if (console_batch_mode) {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_SW_ABORT("Cannot confirm a weak cached host key "
                            "in batch mode");
    }

    fputs(console_continue_prompt, stderr);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    if (line[0] == 'y' || line[0] == 'Y') {
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}